

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
          (BinaryWriterSpec *this,Stream *json_stream,
          WriteBinarySpecStreamFactory *module_stream_factory,string_view source_filename,
          string_view module_filename_noext,WriteBinaryOptions *options)

{
  _Manager_type p_Var1;
  string_view local_30;
  
  local_30.size_ = source_filename.size_;
  local_30.data_ = source_filename.data_;
  this->script_ = (Script *)0x0;
  this->json_stream_ = json_stream;
  *(undefined8 *)&(this->module_stream_factory_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->module_stream_factory_).super__Function_base._M_functor + 8) = 0;
  (this->module_stream_factory_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->module_stream_factory_)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (module_stream_factory->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->module_stream_factory_,(_Any_data *)module_stream_factory,
              __clone_functor);
    (this->module_stream_factory_)._M_invoker = module_stream_factory->_M_invoker;
    (this->module_stream_factory_).super__Function_base._M_manager =
         (module_stream_factory->super__Function_base)._M_manager;
  }
  string_view::operator_cast_to_string(&this->source_filename_,&local_30);
  string_view::operator_cast_to_string(&this->module_filename_noext_,&module_filename_noext);
  this->options_ = options;
  (this->result_).enum_ = Ok;
  this->num_modules_ = 0;
  return;
}

Assistant:

BinaryWriterSpec::BinaryWriterSpec(
    Stream* json_stream,
    WriteBinarySpecStreamFactory module_stream_factory,
    string_view source_filename,
    string_view module_filename_noext,
    const WriteBinaryOptions& options)
    : json_stream_(json_stream),
      module_stream_factory_(module_stream_factory),
      source_filename_(source_filename),
      module_filename_noext_(module_filename_noext),
      options_(options) {}